

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdGetTxInWitnessByHandle
              (void *handle,void *tx_data_handle,int stack_type,uint32_t txin_index,
              uint32_t stack_index,char **stack_data)

{
  ConfidentialTransaction *this;
  char *pcVar1;
  CfdException *pCVar2;
  bool is_bitcoin;
  int stack_type_local;
  undefined1 local_1e0 [32];
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_1c0;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> witness_stack;
  TxInReference ref;
  ScriptWitness local_48;
  
  stack_type_local = stack_type;
  cfd::Initialize();
  std::__cxx11::string::string((string *)&ref,"TransactionData",(allocator *)local_1e0);
  cfd::capi::CheckBuffer(tx_data_handle,(string *)&ref);
  std::__cxx11::string::~string((string *)&ref);
  if (stack_data == (char **)0x0) {
    ref.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)0x4fe2f6;
    ref.super_AbstractTxInReference.txid_._vptr_Txid._0_4_ = 0xe9a;
    ref.super_AbstractTxInReference.txid_.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "CfdGetTxInWitnessByHandle";
    cfd::core::logger::warn<>((CfdSourceLocation *)&ref,"stack data is null.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&ref,"Failed to parameter. stack data is null.",(allocator *)local_1e0);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&ref);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  witness_stack.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  witness_stack.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  witness_stack.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  is_bitcoin = false;
  cfd::capi::ConvertNetType(*(int *)((long)tx_data_handle + 0x10),&is_bitcoin);
  this = *(ConfidentialTransaction **)((long)tx_data_handle + 0x18);
  if (this == (ConfidentialTransaction *)0x0) {
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&ref,"Invalid handle state. tx is null",(allocator *)local_1e0);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)&ref);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (is_bitcoin == true) {
    cfd::core::Transaction::GetTxIn(&ref,(Transaction *)this,txin_index);
    if (stack_type_local != 0) {
      local_1e0._0_8_ = "cfdcapi_transaction.cpp";
      local_1e0._8_4_ = 0xead;
      local_1e0._16_8_ = "CfdGetTxInWitnessByHandle";
      cfd::core::logger::warn<int&>
                ((CfdSourceLocation *)local_1e0,"Invalid stack type[{}]",&stack_type_local);
      pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_1e0,"Invalid stack type.",(allocator *)&local_1c0);
      cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_1e0);
      __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    cfd::core::ScriptWitness::ScriptWitness
              ((ScriptWitness *)local_1e0,&ref.super_AbstractTxInReference.script_witness_);
    cfd::core::ScriptWitness::GetWitness(&local_1c0,(ScriptWitness *)local_1e0);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
              (&witness_stack,&local_1c0);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_1c0);
    cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)local_1e0);
    cfd::core::AbstractTxInReference::~AbstractTxInReference(&ref.super_AbstractTxInReference);
  }
  else {
    cfd::core::ConfidentialTransaction::GetTxIn((ConfidentialTxInReference *)&ref,this,txin_index);
    if (stack_type_local == 1) {
      cfd::core::ScriptWitness::ScriptWitness((ScriptWitness *)local_1e0,&local_48);
      cfd::core::ScriptWitness::GetWitness(&local_1c0,(ScriptWitness *)local_1e0);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (&witness_stack,&local_1c0);
    }
    else {
      if (stack_type_local != 0) {
        local_1e0._0_8_ = "cfdcapi_transaction.cpp";
        local_1e0._8_4_ = 0xebc;
        local_1e0._16_8_ = "CfdGetTxInWitnessByHandle";
        cfd::core::logger::warn<int&>
                  ((CfdSourceLocation *)local_1e0,"Invalid stack type[{}]",&stack_type_local);
        pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_1e0,"Invalid stack type.",(allocator *)&local_1c0);
        cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_1e0);
        __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException
                   );
      }
      cfd::core::ScriptWitness::ScriptWitness
                ((ScriptWitness *)local_1e0,&ref.super_AbstractTxInReference.script_witness_);
      cfd::core::ScriptWitness::GetWitness(&local_1c0,(ScriptWitness *)local_1e0);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (&witness_stack,&local_1c0);
    }
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_1c0);
    cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)local_1e0);
    cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference
              ((ConfidentialTxInReference *)&ref);
  }
  if ((ulong)stack_index <
      (ulong)(((long)witness_stack.
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)witness_stack.
                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0x18)) {
    cfd::core::ByteData::GetHex_abi_cxx11_
              ((string *)&ref,
               witness_stack.
               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
               .super__Vector_impl_data._M_start + stack_index);
    pcVar1 = cfd::capi::CreateString((string *)&ref);
    *stack_data = pcVar1;
    std::__cxx11::string::~string((string *)&ref);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&witness_stack);
    return 0;
  }
  ref.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)0x4fe2f6;
  ref.super_AbstractTxInReference.txid_._vptr_Txid._0_4_ = 0xec7;
  ref.super_AbstractTxInReference.txid_.data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = "CfdGetTxInWitnessByHandle";
  cfd::core::logger::warn<>((CfdSourceLocation *)&ref,"stackIndex is illegal.");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&ref,"Failed to parameter. stackIndex out of witness stack.",
             (allocator *)local_1e0);
  cfd::core::CfdException::CfdException(pCVar2,kCfdOutOfRangeError,(string *)&ref);
  __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxInWitnessByHandle(
    void* handle, void* tx_data_handle, int stack_type, uint32_t txin_index,
    uint32_t stack_index, char** stack_data) {
  try {
    cfd::Initialize();
    CheckBuffer(tx_data_handle, kPrefixTransactionData);
    if (stack_data == nullptr) {
      warn(CFD_LOG_SOURCE, "stack data is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. stack data is null.");
    }
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(tx_data_handle);

    std::vector<ByteData> witness_stack;
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      const TxInReference ref = tx->GetTxIn(txin_index);
      if (stack_type != kCfdTxWitnessStackNormal) {
        warn(CFD_LOG_SOURCE, "Invalid stack type[{}]", stack_type);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Invalid stack type.");
      }
      witness_stack = ref.GetScriptWitness().GetWitness();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      const ConfidentialTxInReference ref = tx->GetTxIn(txin_index);
      if (stack_type == kCfdTxWitnessStackNormal) {
        witness_stack = ref.GetScriptWitness().GetWitness();
      } else if (stack_type == kCfdTxWitnessStackPegin) {
        witness_stack = ref.GetPeginWitness().GetWitness();
      } else {
        warn(CFD_LOG_SOURCE, "Invalid stack type[{}]", stack_type);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Invalid stack type.");
      }
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    if (witness_stack.size() <= stack_index) {
      warn(CFD_LOG_SOURCE, "stackIndex is illegal.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. stackIndex out of witness stack.");
    }
    *stack_data = CreateString(witness_stack[stack_index].GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}